

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void __thiscall
ParserCallbacks::handleObject
          (ParserCallbacks *this,QPDFObjectHandle *obj,size_t offset,size_t length)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar1 = QPDFObjectHandle::isName();
  if (cVar1 != '\0') {
    QPDFObjectHandle::getName_abi_cxx11_();
    bVar2 = std::operator==(&local_70,"/Abort");
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"test suite: terminating parsing");
      std::endl<char,std::char_traits<char>>(poVar4);
      QPDFObjectHandle::ParserCallbacks::terminateParsing();
    }
  }
  pcVar5 = (char *)QPDFObjectHandle::getTypeName();
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
  poVar4 = std::operator<<(poVar4,", offset=");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", length=");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,": ");
  cVar1 = QPDFObjectHandle::isInlineImage();
  if (cVar1 == '\0') {
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
    std::endl<char,std::char_traits<char>>(poVar4);
    this_00 = &local_70;
  }
  else {
    iVar3 = QPDFObjectHandle::getTypeCode();
    if (iVar3 != 0xc) {
      __assert_fail("obj.getTypeCode() == ::ot_inlineimage",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x78,
                    "virtual void ParserCallbacks::handleObject(QPDFObjectHandle, size_t, size_t)");
    }
    QPDFObjectHandle::getInlineImageValue_abi_cxx11_();
    QUtil::hex_encode((string *)&local_70);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void
ParserCallbacks::handleObject(QPDFObjectHandle obj, size_t offset, size_t length)
{
    if (obj.isName() && (obj.getName() == "/Abort")) {
        std::cout << "test suite: terminating parsing" << std::endl;
        terminateParsing();
    }
    std::cout << obj.getTypeName() << ", offset=" << offset << ", length=" << length << ": ";
    if (obj.isInlineImage()) {
        // Exercise getTypeCode
        assert(obj.getTypeCode() == ::ot_inlineimage);
        std::cout << QUtil::hex_encode(obj.getInlineImageValue()) << std::endl;
    } else {
        std::cout << obj.unparse() << std::endl;
    }
}